

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void xmlRMutexUnlock(xmlRMutexPtr tok)

{
  uint *puVar1;
  
  if (tok != (xmlRMutexPtr)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)tok);
    puVar1 = &tok->held;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      if (tok->waiters != 0) {
        pthread_cond_signal((pthread_cond_t *)&tok->cv);
      }
      tok->tid = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)tok);
    return;
  }
  return;
}

Assistant:

void
xmlRMutexUnlock(xmlRMutexPtr tok ATTRIBUTE_UNUSED)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_lock(&tok->lock);
    tok->held--;
    if (tok->held == 0) {
        if (tok->waiters)
            pthread_cond_signal(&tok->cv);
        memset(&tok->tid, 0, sizeof(tok->tid));
    }
    pthread_mutex_unlock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    LeaveCriticalSection(&tok->cs);
#endif
}